

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsequentialanimationgroup.cpp
# Opt level: O2

void __thiscall
QSequentialAnimationGroup::updateState
          (QSequentialAnimationGroup *this,State newState,State oldState)

{
  QObjectBindableProperty<QSequentialAnimationGroupPrivate,_QAbstractAnimation_*,_&QSequentialAnimationGroupPrivate::_qt_property_currentAnimation_offset,_nullptr>
  *this_00;
  QSequentialAnimationGroupPrivate *this_01;
  State SVar1;
  parameter_type pQVar2;
  
  this_01 = *(QSequentialAnimationGroupPrivate **)(this + 8);
  QAbstractAnimation::updateState((QAbstractAnimation *)this,newState,oldState);
  this_00 = &this_01->currentAnimation;
  pQVar2 = QObjectBindableProperty<QSequentialAnimationGroupPrivate,_QAbstractAnimation_*,_&QSequentialAnimationGroupPrivate::_qt_property_currentAnimation_offset,_nullptr>
           ::value(this_00);
  if (pQVar2 == (parameter_type)0x0) {
    return;
  }
  if (newState == Running) {
    QObjectBindableProperty<QSequentialAnimationGroupPrivate,_QAbstractAnimation_*,_&QSequentialAnimationGroupPrivate::_qt_property_currentAnimation_offset,_nullptr>
    ::value(this_00);
    SVar1 = QAbstractAnimation::state
                      ((QAbstractAnimation *)
                       (this_00->super_QPropertyData<QAbstractAnimation_*>).val);
    if ((oldState == Paused) && (SVar1 == Paused)) {
      QObjectBindableProperty<QSequentialAnimationGroupPrivate,_QAbstractAnimation_*,_&QSequentialAnimationGroupPrivate::_qt_property_currentAnimation_offset,_nullptr>
      ::value(this_00);
      QAbstractAnimation::start
                ((QAbstractAnimation *)(this_00->super_QPropertyData<QAbstractAnimation_*>).val,
                 KeepWhenStopped);
      return;
    }
  }
  else {
    if (newState != Paused) {
      if (newState != Stopped) {
        return;
      }
      QObjectBindableProperty<QSequentialAnimationGroupPrivate,_QAbstractAnimation_*,_&QSequentialAnimationGroupPrivate::_qt_property_currentAnimation_offset,_nullptr>
      ::value(this_00);
      QAbstractAnimation::stop
                ((QAbstractAnimation *)(this_00->super_QPropertyData<QAbstractAnimation_*>).val);
      return;
    }
    QObjectBindableProperty<QSequentialAnimationGroupPrivate,_QAbstractAnimation_*,_&QSequentialAnimationGroupPrivate::_qt_property_currentAnimation_offset,_nullptr>
    ::value(this_00);
    SVar1 = QAbstractAnimation::state
                      ((QAbstractAnimation *)
                       (this_00->super_QPropertyData<QAbstractAnimation_*>).val);
    if ((oldState == Running) && (SVar1 == Running)) {
      QObjectBindableProperty<QSequentialAnimationGroupPrivate,_QAbstractAnimation_*,_&QSequentialAnimationGroupPrivate::_qt_property_currentAnimation_offset,_nullptr>
      ::value(this_00);
      QAbstractAnimation::pause
                ((QAbstractAnimation *)(this_00->super_QPropertyData<QAbstractAnimation_*>).val);
      return;
    }
  }
  QSequentialAnimationGroupPrivate::restart(this_01);
  return;
}

Assistant:

void QSequentialAnimationGroup::updateState(QAbstractAnimation::State newState,
                                            QAbstractAnimation::State oldState)
{
    Q_D(QSequentialAnimationGroup);
    QAnimationGroup::updateState(newState, oldState);

    if (!d->currentAnimation)
        return;

    switch (newState) {
    case Stopped:
        d->currentAnimation->stop();
        break;
    case Paused:
        if (oldState == d->currentAnimation->state()
            && oldState == QSequentialAnimationGroup::Running) {
                d->currentAnimation->pause();
            }
        else
            d->restart();
        break;
    case Running:
        if (oldState == d->currentAnimation->state()
            && oldState == QSequentialAnimationGroup::Paused)
            d->currentAnimation->start();
        else
            d->restart();
        break;
    }
}